

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O2

void __thiscall ser::CentralizedFileFormat::WriteTables(CentralizedFileFormat *this,string *param_1)

{
  ostream *poVar1;
  JSONNode mainNode;
  JSONNode offsetTableNode;
  JSONNode fieldsTableNode;
  JSONNode globalInfoNode;
  json_string local_230;
  ofstream fs;
  
  GlobalInfoToJSON((CentralizedFileFormat *)&globalInfoNode);
  FieldsTable::TableToJSON((FieldsTable *)&fieldsTableNode);
  OffsetTable::TableToJSON((OffsetTable *)&offsetTableNode);
  ::JSONNode::JSONNode(&mainNode,'\x05');
  ::JSONNode::push_back(&mainNode,&globalInfoNode);
  ::JSONNode::push_back(&mainNode,&fieldsTableNode);
  ::JSONNode::push_back(&mainNode,&offsetTableNode);
  std::ofstream::ofstream(&fs,(this->databaseFile_)._M_dataplus._M_p,_S_out);
  ::JSONNode::write_formatted_abi_cxx11_(&local_230,&mainNode,0x800);
  poVar1 = std::operator<<((ostream *)&fs,(string *)&local_230);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_230);
  std::ofstream::close();
  std::ofstream::~ofstream(&fs);
  ::JSONNode::~JSONNode(&mainNode);
  ::JSONNode::~JSONNode(&offsetTableNode);
  ::JSONNode::~JSONNode(&fieldsTableNode);
  ::JSONNode::~JSONNode(&globalInfoNode);
  return;
}

Assistant:

void CentralizedFileFormat::WriteTables(const std::string&)
{
    // Discard fieldName, as both tables are written completely onto the file

    JSONNode globalInfoNode = GlobalInfoToJSON();
    JSONNode fieldsTableNode = pFieldsTable_->TableToJSON();
    JSONNode offsetTableNode = pOffsetTable_->TableToJSON();

    JSONNode mainNode;
    mainNode.push_back(globalInfoNode);
    mainNode.push_back(fieldsTableNode);
    mainNode.push_back(offsetTableNode);

    std::ofstream fs(databaseFile_.c_str());
    fs << mainNode.write_formatted() << "\n";
    fs.close();
}